

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O2

void __thiscall QProgressBar::setFormat(QProgressBar *this,QString *format)

{
  QString *s1;
  byte *pbVar1;
  long lVar2;
  bool bVar3;
  
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  s1 = (QString *)(lVar2 + 0x278);
  bVar3 = ::comparesEqual(s1,format);
  if (bVar3) {
    return;
  }
  QString::operator=(s1,(QString *)format);
  pbVar1 = (byte *)(lVar2 + 0x264);
  *pbVar1 = *pbVar1 & 0xfd;
  QWidget::update(&this->super_QWidget);
  return;
}

Assistant:

void QProgressBar::setFormat(const QString &format)
{
    Q_D(QProgressBar);
    if (d->format == format)
        return;
    d->format = format;
    d->defaultFormat = false;
    update();
}